

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *p_vector)

{
  cpp_dec_float<100U,_int,_void> *v_00;
  DataKey *pDVar1;
  uint *puVar2;
  uint *puVar3;
  Status SVar4;
  uint uVar5;
  pointer pnVar6;
  SPxId *pSVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int32_t iVar15;
  int iVar16;
  Status SVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar18;
  undefined8 *puVar19;
  ulong uVar20;
  cpp_dec_float<100U,_int,_void> *v_01;
  long lVar21;
  long lVar22;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_a8 [8];
  DataKey DStack_a0;
  uint local_98 [13];
  bool bStack_64;
  undefined8 local_60;
  DataKey local_58;
  fpclass_type local_4c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_40;
  DataKey local_38;
  
  if (this->initialized != false) {
    if (this->theRep == ROW) {
      pnVar6 = (p_vector->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar18 = (p_vector->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar18 != pnVar6;
          pnVar18 = pnVar18 + 1) {
        (pnVar18->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar18->m_backend).prec_elem = 0x10;
        (pnVar18->m_backend).data._M_elems[0] = 0;
        (pnVar18->m_backend).data._M_elems[1] = 0;
        (pnVar18->m_backend).data._M_elems[2] = 0;
        (pnVar18->m_backend).data._M_elems[3] = 0;
        (pnVar18->m_backend).data._M_elems[4] = 0;
        (pnVar18->m_backend).data._M_elems[5] = 0;
        (pnVar18->m_backend).data._M_elems[6] = 0;
        (pnVar18->m_backend).data._M_elems[7] = 0;
        (pnVar18->m_backend).data._M_elems[8] = 0;
        (pnVar18->m_backend).data._M_elems[9] = 0;
        (pnVar18->m_backend).data._M_elems[10] = 0;
        (pnVar18->m_backend).data._M_elems[0xb] = 0;
        (pnVar18->m_backend).data._M_elems[0xc] = 0;
        (pnVar18->m_backend).data._M_elems[0xd] = 0;
        (pnVar18->m_backend).data._M_elems[0xe] = 0;
        (pnVar18->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + 0x3d) = 0;
      }
      uVar5 = (this->thecovectors->set).thenum;
      uVar20 = (ulong)uVar5;
      local_48 = p_vector;
      if ((this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesense == MINIMIZE) {
        if (0 < (int)uVar5) {
          local_40 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          lVar22 = uVar20 + 1;
          lVar21 = uVar20 * 10 + -1;
          do {
            pSVar7 = (this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < pSVar7[lVar22 + -2].super_DataKey.info) {
              pnVar18 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = *(uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x48);
              puVar2 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x18);
              uVar8 = *(undefined8 *)(puVar2 + 2);
              local_98[8] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
              local_98[9] = (uint)uVar8;
              local_98[10] = (uint)((ulong)uVar8 >> 0x20);
              puVar2 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x24);
              local_98._16_8_ = *(undefined8 *)puVar2;
              uVar8 = *(undefined8 *)(puVar2 + 2);
              local_98[6] = (uint)uVar8;
              local_98[7] = (uint)((ulong)uVar8 >> 0x20);
              puVar2 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x34);
              local_98._0_8_ = *(undefined8 *)puVar2;
              local_98._8_8_ = *(undefined8 *)(puVar2 + 2);
              pDVar1 = (DataKey *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x44);
              local_a8 = *(undefined1 (*) [8])pDVar1;
              DStack_a0 = pDVar1[1];
              local_4c = *(fpclass_type *)((long)&pnVar18->m_backend + lVar21 * 8 + -8);
              uVar8 = *(undefined8 *)((long)&pnVar18->m_backend + lVar21 * 8);
              iVar15 = *(int32_t *)((long)&pnVar18->m_backend + lVar21 * 8 + -4);
              local_38 = pSVar7[lVar22 + -2].super_DataKey;
              SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
              iVar16 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_40,&local_58);
              pnVar18 = (local_48->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar18[iVar16].m_backend.data._M_elems[0] = uVar5;
              puVar2 = (uint *)((long)&pnVar18[iVar16].m_backend.data + 0x30);
              *(ulong *)puVar2 = CONCAT44(local_98[8],local_98[7]);
              *(ulong *)(puVar2 + 2) = CONCAT44(local_98[10],local_98[9]);
              puVar2 = (uint *)((long)&pnVar18[iVar16].m_backend.data + 0x24);
              *(undefined8 *)puVar2 = local_98._16_8_;
              *(ulong *)(puVar2 + 2) = CONCAT44(local_98[7],local_98[6]);
              puVar2 = (uint *)((long)&pnVar18[iVar16].m_backend.data + 0x14);
              *(undefined8 *)puVar2 = local_98._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_98._8_8_;
              pDVar1 = (DataKey *)((long)&pnVar18[iVar16].m_backend.data + 4);
              pDVar1->info = local_a8._0_4_;
              pDVar1->idx = local_a8._4_4_;
              pDVar1[1] = DStack_a0;
              pnVar18[iVar16].m_backend.exp = local_4c;
              pnVar18[iVar16].m_backend.neg = (bool)((uVar5 != 0 || (int)uVar8 != 0) ^ (byte)iVar15)
              ;
              pnVar18[iVar16].m_backend.fpclass = (int)uVar8;
              pnVar18[iVar16].m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
            }
            lVar22 = lVar22 + -1;
            lVar21 = lVar21 + -10;
          } while (1 < lVar22);
        }
      }
      else if (0 < (int)uVar5) {
        lVar22 = uVar20 + 1;
        lVar21 = uVar20 * 10 + -1;
        do {
          pSVar7 = (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar7[lVar22 + -2].super_DataKey.info) {
            pnVar18 = (this->theFvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_58 = pSVar7[lVar22 + -2].super_DataKey;
            SPxColId::SPxColId((SPxColId *)local_a8,(SPxId *)&local_58);
            iVar16 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_a8);
            pnVar6 = (local_48->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x48);
            uVar8 = *(undefined8 *)(puVar2 + 2);
            puVar3 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x38);
            uVar9 = *(undefined8 *)puVar3;
            uVar10 = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x28);
            uVar11 = *(undefined8 *)puVar3;
            uVar12 = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)&pnVar18->m_backend + lVar21 * 8 + -0x18);
            uVar13 = *(undefined8 *)puVar3;
            uVar14 = *(undefined8 *)(puVar3 + 2);
            *(undefined8 *)&pnVar6[iVar16].m_backend.data = *(undefined8 *)puVar2;
            *(undefined8 *)((long)&pnVar6[iVar16].m_backend.data + 8) = uVar8;
            puVar2 = (uint *)((long)&pnVar6[iVar16].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = uVar9;
            *(undefined8 *)(puVar2 + 2) = uVar10;
            puVar2 = (uint *)((long)&pnVar6[iVar16].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = uVar11;
            *(undefined8 *)(puVar2 + 2) = uVar12;
            puVar2 = (uint *)((long)&pnVar6[iVar16].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = uVar13;
            *(undefined8 *)(puVar2 + 2) = uVar14;
            pnVar6[iVar16].m_backend.exp =
                 *(fpclass_type *)((long)&pnVar18->m_backend + lVar21 * 8 + -8);
            pnVar6[iVar16].m_backend.neg =
                 SUB41(*(int32_t *)((long)&pnVar18->m_backend + lVar21 * 8 + -4),0);
            uVar8 = *(undefined8 *)((long)&pnVar18->m_backend + lVar21 * 8);
            pnVar6[iVar16].m_backend.fpclass = (int)uVar8;
            pnVar6[iVar16].m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
          }
          lVar22 = lVar22 + -1;
          lVar21 = lVar21 + -10;
        } while (1 < lVar22);
      }
    }
    else {
      if (0 < (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar21 = 0;
        lVar22 = 0;
        do {
          SVar4 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[lVar22];
          if (((uint)SVar4 < 9) && ((0x156U >> (SVar4 & 0x1f) & 1) != 0)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)&(((p_vector->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar21),0);
          }
          else {
            pnVar18 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            v_00 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar18->m_backend).data + lVar21);
            v_01 = (cpp_dec_float<100U,_int,_void> *)
                   ((long)&((this->thePvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar21);
            local_60._0_4_ = cpp_dec_float_finite;
            local_60._4_4_ = 0x10;
            local_a8._0_4_ = 0;
            local_a8._4_4_ = 0;
            DStack_a0.info = 0;
            DStack_a0.idx = 0;
            local_98[0] = 0;
            local_98[1] = 0;
            local_98[2] = 0;
            local_98[3] = 0;
            local_98[4] = 0;
            local_98[5] = 0;
            local_98[6] = 0;
            local_98[7] = 0;
            local_98[8] = 0;
            local_98[9] = 0;
            local_98[10] = 0;
            local_98[0xb] = 0;
            local_98[0xc] = 0;
            bStack_64 = false;
            if (v_01 == (cpp_dec_float<100U,_int,_void> *)local_a8) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a8,v_00);
              if (local_a8._0_4_ != 0 || (fpclass_type)local_60 != cpp_dec_float_finite) {
                bStack_64 = (bool)(bStack_64 ^ 1);
              }
            }
            else {
              if (v_00 != (cpp_dec_float<100U,_int,_void> *)local_a8) {
                local_a8._0_4_ = (v_00->data)._M_elems[0];
                local_a8._4_4_ = (v_00->data)._M_elems[1];
                DStack_a0 = *(DataKey *)((v_00->data)._M_elems + 2);
                local_98._0_8_ = *(undefined8 *)((v_00->data)._M_elems + 4);
                local_98._8_8_ = *(undefined8 *)((v_00->data)._M_elems + 6);
                local_98._16_8_ = *(undefined8 *)((v_00->data)._M_elems + 8);
                uVar8 = *(undefined8 *)((v_00->data)._M_elems + 10);
                uVar9 = *(undefined8 *)((v_00->data)._M_elems + 0xc);
                uVar10 = *(undefined8 *)((v_00->data)._M_elems + 0xe);
                local_98[8] = (uint)uVar9;
                local_98[9] = (uint)((ulong)uVar9 >> 0x20);
                local_98[10] = (uint)uVar10;
                local_98[0xb] = (uint)((ulong)uVar10 >> 0x20);
                local_98[6] = (uint)uVar8;
                local_98[7] = (uint)((ulong)uVar8 >> 0x20);
                local_98[0xc] = *(int *)((long)&(pnVar18->m_backend).data + lVar21 + 0x40);
                bStack_64 = *(bool *)((long)&(pnVar18->m_backend).data + lVar21 + 0x44);
                local_60 = *(undefined8 *)((long)&(pnVar18->m_backend).data + lVar21 + 0x48);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a8,v_01);
            }
            pnVar18 = (p_vector->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar19 = (undefined8 *)((long)&(pnVar18->m_backend).data + lVar21 + 0x30);
            *puVar19 = CONCAT44(local_98[9],local_98[8]);
            puVar19[1] = CONCAT44(local_98[0xb],local_98[10]);
            puVar2 = (uint *)((long)&(pnVar18->m_backend).data + lVar21 + 0x20);
            *(undefined8 *)puVar2 = local_98._16_8_;
            *(ulong *)(puVar2 + 2) = CONCAT44(local_98[7],local_98[6]);
            puVar2 = (uint *)((long)&(pnVar18->m_backend).data + lVar21 + 0x10);
            *(undefined8 *)puVar2 = local_98._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_98._8_8_;
            pDVar1 = (DataKey *)((long)&(pnVar18->m_backend).data + lVar21);
            pDVar1->info = local_a8._0_4_;
            pDVar1->idx = local_a8._4_4_;
            pDVar1[1] = DStack_a0;
            *(uint *)((long)&(pnVar18->m_backend).data + lVar21 + 0x40) = local_98[0xc];
            *(bool *)((long)&(pnVar18->m_backend).data + lVar21 + 0x44) = bStack_64;
            *(undefined8 *)((long)&(pnVar18->m_backend).data + lVar21 + 0x48) = local_60;
          }
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x50;
        } while (lVar22 < (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      if ((this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesense == MINIMIZE) {
        local_a8._0_4_ = 0;
        local_a8._4_4_ = -0x40100000;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)p_vector,(double *)local_a8);
      }
    }
    SVar17 = status(this);
    return SVar17;
  }
  puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_a8 = (undefined1  [8])local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"XSOLVE09 No Problem loaded","");
  *puVar19 = &PTR__SPxException_006a9ee8;
  puVar19[1] = puVar19 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar19 + 1),local_a8,(long)DStack_a0 + (long)local_a8);
  *puVar19 = &PTR__SPxException_006aa100;
  __cxa_throw(puVar19,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}